

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O1

void Minisat::sort<unsigned_int,reduceDB_lt>(uint *array,int size,reduceDB_lt lt)

{
  ulong uVar1;
  ulong *puVar2;
  ulong *puVar3;
  float *pfVar4;
  float fVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  long lVar10;
  bool bVar11;
  uint uVar12;
  uint *puVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint *puVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  long local_80;
  
  while( true ) {
    if (size < 0x10) {
      selectionSort<unsigned_int,reduceDB_lt>(array,size,lt);
      return;
    }
    if (0x20 < size) break;
    uVar19 = array[(uint)size >> 1];
    puVar13 = ((lt.ca)->super_RegionAllocator<unsigned_int>).memory;
    uVar17 = (ulong)(uint)size;
    lVar26 = -1;
    while( true ) {
      fVar5 = *(float *)((long)puVar13 +
                        (ulong)(puVar13[(ulong)uVar19 + 1] & 0xfffffffc) + (ulong)uVar19 * 4 + 8);
      lVar26 = (long)(int)lVar26;
      puVar20 = array + lVar26;
      do {
        lVar26 = lVar26 + 1;
        uVar6 = puVar20[1];
        puVar20 = puVar20 + 1;
        pfVar4 = (float *)((long)(puVar13 + uVar6) + (*(ulong *)(puVar13 + uVar6) >> 0x22) * 4 + 8);
      } while (*pfVar4 <= fVar5 && fVar5 != *pfVar4);
      uVar17 = (ulong)(int)uVar17;
      do {
        lVar10 = uVar17 - 1;
        uVar17 = uVar17 - 1;
      } while (fVar5 < *(float *)((long)(puVar13 + array[lVar10]) +
                                 (*(ulong *)(puVar13 + array[lVar10]) >> 0x22) * 4 + 8));
      if ((long)uVar17 <= lVar26) break;
      *puVar20 = array[lVar10];
      array[uVar17] = uVar6;
    }
    sort<unsigned_int,reduceDB_lt>(array,(int)lVar26,lt);
    size = size - (int)lVar26;
    array = puVar20;
  }
  uVar17 = (ulong)(uint)size;
  puVar13 = (uint *)operator_new__(uVar17 * 4);
  uVar19 = 1;
  bVar7 = false;
  do {
    bVar11 = bVar7;
    puVar20 = array;
    array = puVar13;
    uVar6 = uVar19 * 2;
    lVar26 = (long)(int)uVar19;
    uVar22 = 0;
    uVar23 = uVar6;
    local_80 = lVar26;
    do {
      uVar24 = uVar23;
      if ((long)uVar17 < (long)(int)uVar23) {
        uVar24 = size;
      }
      uVar1 = uVar22 + (long)(int)uVar6;
      uVar14 = (uint)uVar1;
      if (size < (int)(uint)uVar1) {
        uVar14 = size;
      }
      uVar15 = lVar26 + uVar22;
      uVar25 = (uint)uVar15;
      uVar9 = uVar19 + uVar25;
      if (size <= (int)(uVar19 + uVar25)) {
        uVar9 = size;
      }
      uVar12 = (uint)uVar22;
      uVar16 = uVar12;
      if ((0 < (int)uVar19) && ((long)uVar15 < (long)(int)uVar9)) {
        puVar13 = ((lt.ca)->super_RegionAllocator<unsigned_int>).memory;
        uVar27 = uVar15 & 0xffffffff;
        uVar18 = uVar22 & 0xffffffff;
        do {
          puVar2 = (ulong *)(puVar13 + puVar20[(int)uVar18]);
          puVar3 = (ulong *)(puVar13 + puVar20[(int)uVar27]);
          fVar5 = *(float *)((long)puVar3 + (*puVar3 >> 0x22) * 4 + 8);
          pfVar4 = (float *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 8);
          bVar7 = fVar5 == *pfVar4;
          bVar8 = fVar5 < *pfVar4;
          uVar21 = puVar20[(int)uVar27];
          if (!bVar8 && !bVar7) {
            uVar21 = puVar20[(int)uVar18];
          }
          uVar16 = (int)uVar18 + (uint)((!NAN(fVar5) && !NAN(*pfVar4)) && (!bVar8 && !bVar7));
          uVar18 = (ulong)uVar16;
          uVar25 = (int)uVar27 + (uint)(bVar8 || bVar7);
          uVar27 = (ulong)uVar25;
          array[uVar22] = uVar21;
          uVar22 = uVar22 + 1;
        } while (((long)(int)uVar16 < (long)uVar15) && ((int)uVar25 < (int)uVar9));
      }
      uVar21 = (uint)uVar22;
      if ((long)(int)uVar16 < (long)uVar15) {
        memcpy(array + (int)uVar21,puVar20 + (int)uVar16,
               (ulong)((uVar12 + (uVar19 - 1)) - uVar16) * 4 + 4);
        uVar21 = (uVar21 + (int)local_80) - uVar16;
      }
      if ((int)uVar25 < (int)uVar9) {
        memcpy(array + (int)uVar21,puVar20 + (int)uVar25,(ulong)(uVar14 + ~uVar25) * 4 + 4);
        uVar21 = (uVar24 + uVar21) - uVar25;
      }
      local_80 = local_80 + (int)uVar6;
      uVar23 = uVar23 + uVar6;
      uVar22 = uVar1;
    } while ((long)uVar1 < (long)(uVar17 - lVar26));
    if ((int)uVar21 < size) {
      memcpy(array + (int)uVar21,puVar20 + (int)uVar21,(ulong)(~uVar21 + size) * 4 + 4);
    }
    puVar13 = puVar20;
    uVar19 = uVar6;
    bVar7 = (bool)(bVar11 ^ 1);
  } while ((int)uVar6 < size);
  if (!bVar11) {
    memcpy(puVar20,array,uVar17 * 4);
    puVar20 = array;
  }
  if (puVar20 == (uint *)0x0) {
    return;
  }
  operator_delete__(puVar20);
  return;
}

Assistant:

void sort(T *array, int size, LessThan lt)
{
    if (size <= 15) {
        selectionSort(array, size, lt);
    } else if (size > 32) {
        mergesort(array, size, lt);
    } else {
        T pivot = array[size / 2];
        T tmp;
        int i = -1;
        int j = size;

        for (;;) {
            do
                i++;
            while (lt(array[i], pivot));
            do
                j--;
            while (lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i];
            array[i] = array[j];
            array[j] = tmp;
        }

        sort(array, i, lt);
        sort(&array[i], size - i, lt);
    }
}